

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask9_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  
  uVar1 = in[3];
  uVar2 = in[4];
  uVar3 = in[5];
  *out = uVar1 << 0x1b | in[2] << 0x12 | in[1] << 9 | *in;
  uVar4 = in[7];
  out[1] = uVar4 << 0x1f | in[6] << 0x16 | uVar3 << 0xd | uVar2 << 4 | uVar1 >> 5;
  out[2] = uVar4 >> 1;
  return out + 3;
}

Assistant:

uint32_t *__fastpackwithoutmask9_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (9 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (9 - 8);
  ++in;

  return out + 1;
}